

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

void AddPathEnvVars(void)

{
  int capacity;
  char *out;
  int dirname_length;
  int local_1c;
  
  capacity = wai_getExecutablePath((char *)0x0,0,(int *)0x0);
  out = (char *)malloc((long)(capacity + 1));
  wai_getExecutablePath(out,capacity,&local_1c);
  out[local_1c] = '\0';
  setenv("MS_EXE_DIR",out,1);
  return;
}

Assistant:

void AddPathEnvVars() {
	int length = wai_getExecutablePath(nullptr, 0, nullptr);
	char* path = (char*)malloc(length + 1);
	int dirname_length;
	wai_getExecutablePath(path, length, &dirname_length);
	path[dirname_length] = '\0';
	setEnvVar("MS_EXE_DIR", path);
}